

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.h
# Opt level: O0

void __thiscall
lambda::Parse_ast::Lambda::Lambda(Lambda *this,string *parameter,Parse_ast *expression)

{
  Parse_ast *expression_local;
  string *parameter_local;
  Lambda *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)parameter);
  std::make_unique<lambda::Parse_ast,lambda::Parse_ast>((Parse_ast *)&this->expression_);
  return;
}

Assistant:

explicit Lambda(std::string parameter, Parse_ast expression)
        : parameter_(std::move(parameter)),
          expression_(std::make_unique<Parse_ast>(std::move(expression))) {}